

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneNamesImpl::getDisplayNames
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UTimeZoneNameType *types,int32_t numTypes,
          UDate date,UnicodeString *dest,UErrorCode *status)

{
  UErrorCode UVar1;
  UTimeZoneNameType type;
  ZNames *this_00;
  UChar *pUVar2;
  char *this_01;
  ulong uVar3;
  ulong uVar4;
  ConstChar16Ptr local_b8;
  Mutex lock_1;
  Mutex lock;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (0x1f < (ushort)(tzID->fUnion).fStackFields.fLengthAndFlags)) {
    lock.fMutex = (UMutex *)gDataMutex;
    umtx_lock_63((UMutex *)gDataMutex);
    this_00 = loadTimeZoneNames(this,tzID,status);
    UVar1 = *status;
    Mutex::~Mutex(&lock);
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar3 = 0;
      uVar4 = (ulong)(uint)numTypes;
      if (numTypes < 1) {
        uVar4 = uVar3;
      }
      this_01 = (char *)0x0;
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        type = types[uVar3];
        pUVar2 = ZNames::getName(this_00,type);
        if (pUVar2 == (UChar *)0x0) {
          if ((ZNames *)this_01 == (ZNames *)0x0) {
            lock.fMutex = (UMutex *)&PTR__UnicodeString_003b1268;
            (*(this->super_TimeZoneNames).super_UObject._vptr_UObject[7])(date,this,tzID,&lock);
            this_01 = "<empty>";
            UnicodeString::~UnicodeString((UnicodeString *)&lock);
          }
          if ((this_01 != "<empty>") &&
             (pUVar2 = ZNames::getName((ZNames *)this_01,type), pUVar2 != (UChar *)0x0))
          goto LAB_0020bbb9;
          UnicodeString::setToBogus(dest);
        }
        else {
LAB_0020bbb9:
          local_b8.p_ = pUVar2;
          UnicodeString::setTo(dest,'\x01',&local_b8,-1);
        }
        dest = dest + 1;
      }
    }
  }
  return;
}

Assistant:

void TimeZoneNamesImpl::getDisplayNames(const UnicodeString& tzID,
        const UTimeZoneNameType types[], int32_t numTypes,
        UDate date, UnicodeString dest[], UErrorCode& status) const {
    if (U_FAILURE(status)) return;

    if (tzID.isEmpty()) { return; }
    void* tznames = NULL;
    void* mznames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl*>(this);

    // Load the time zone strings
    {
        Mutex lock(&gDataMutex);
        tznames = (void*) nonConstThis->loadTimeZoneNames(tzID, status);
        if (U_FAILURE(status)) { return; }
    }
    U_ASSERT(tznames != NULL);

    // Load the values into the dest array
    for (int i = 0; i < numTypes; i++) {
        UTimeZoneNameType type = types[i];
        const UChar* name = ((ZNames*)tznames)->getName(type);
        if (name == NULL) {
            if (mznames == NULL) {
                // Load the meta zone name
                UnicodeString mzID;
                getMetaZoneID(tzID, date, mzID);
                if (mzID.isEmpty()) {
                    mznames = (void*) EMPTY;
                } else {
                    // Load the meta zone strings
                    // Mutex is scoped to the "else" statement
                    Mutex lock(&gDataMutex);
                    mznames = (void*) nonConstThis->loadMetaZoneNames(mzID, status);
                    if (U_FAILURE(status)) { return; }
                    // Note: when the metazone doesn't exist, in Java, loadMetaZoneNames returns
                    // a dummy object instead of NULL.
                    if (mznames == NULL) {
                        mznames = (void*) EMPTY;
                    }
                }
            }
            U_ASSERT(mznames != NULL);
            if (mznames != EMPTY) {
                name = ((ZNames*)mznames)->getName(type);
            }
        }
        if (name != NULL) {
            dest[i].setTo(TRUE, name, -1);
        } else {
            dest[i].setToBogus();
        }
    }
}